

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_handle_initialize
              (plugin_manager manager,plugin p,loader_impl impl,char *name,void **handle_ptr)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  loader_handle_impl handle_impl_00;
  loader_handle_impl plVar4;
  loader_handle_impl plVar5;
  long in_RDX;
  plugin in_RSI;
  loader_handle_impl iterator_handle_impl;
  size_t iterator;
  loader_handle_impl handle_impl;
  size_t init_order;
  loader_path path;
  loader_impl_interface iface;
  loader_impl in_stack_ffffffffffffef98;
  vector in_stack_ffffffffffffefa0;
  loader_handle_impl plVar6;
  loader_handle in_stack_ffffffffffffefa8;
  loader_impl_interface in_stack_ffffffffffffefb0;
  loader_impl in_stack_ffffffffffffefb8;
  set in_stack_ffffffffffffefc8;
  loader_handle_impl in_stack_ffffffffffffefd0;
  plugin_manager in_stack_ffffffffffffefd8;
  loader_impl in_stack_ffffffffffffefe0;
  plugin_manager in_stack_ffffffffffffefe8;
  loader_impl in_stack_fffffffffffff008;
  plugin in_stack_fffffffffffff010;
  plugin_manager in_stack_fffffffffffff018;
  
  if ((in_RDX != 0) && (pvVar2 = plugin_iface(in_RSI), pvVar2 != (void *)0x0)) {
    iVar1 = loader_impl_initialize
                      (in_stack_fffffffffffff018,in_stack_fffffffffffff010,in_stack_fffffffffffff008
                      );
    if (iVar1 != 0) {
      return 1;
    }
    sVar3 = loader_impl_handle_name
                      (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0,
                       (char *)in_stack_ffffffffffffefc8);
    if ((1 < sVar3) &&
       (pvVar2 = loader_impl_get_handle(in_stack_ffffffffffffef98,(char *)0x132196),
       pvVar2 != (void *)0x0)) {
      log_write_impl_va("metacall",0x502,"loader_impl_handle_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,LOG_LEVEL_ERROR,
                        "Initialize handle failed, handle with name %s already loaded",
                        &stack0xffffffffffffefc8);
      return 1;
    }
    handle_impl_00 = (loader_handle_impl)vector_size(*(vector *)(in_RDX + 0x20));
    vector_push_back_empty((vector)0x13220a);
    plVar4 = loader_impl_load_handle
                       (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
                        in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
                        (size_t)in_stack_ffffffffffffef98);
    if (plVar4 != (loader_handle_impl)0x0) {
      plVar4->populated = 1;
      iVar1 = set_insert(in_stack_ffffffffffffefc8,handle_impl_00,plVar4);
      plVar4 = handle_impl_00;
      if (iVar1 == 0) {
        iVar1 = loader_impl_handle_register
                          (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                           (char *)in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                           (void **)in_stack_ffffffffffffefc8);
        if (iVar1 == 0) {
          vector_set(in_stack_ffffffffffffefa0,(size_t)in_stack_ffffffffffffef98,(void *)0x1322b9);
          return 0;
        }
        set_remove(in_stack_ffffffffffffefc8,handle_impl_00);
        plVar4 = handle_impl_00;
      }
      while( true ) {
        plVar6 = (loader_handle_impl)((long)&plVar4->magic + 1);
        plVar4 = plVar6;
        plVar5 = (loader_handle_impl)vector_size(*(vector *)(in_RDX + 0x20));
        if (plVar5 <= plVar6) break;
        vector_at((vector)in_stack_ffffffffffffef98,0x13232f);
        loader_impl_destroy_handle(handle_impl_00);
      }
      vector_pop_back((vector)0x132362);
      log_write_impl_va("metacall",0x52a,"loader_impl_handle_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,LOG_LEVEL_ERROR,"Error when loading handle: %s",&stack0xffffffffffffefc8);
      loader_impl_destroy_handle(handle_impl_00);
    }
  }
  return 1;
}

Assistant:

int loader_impl_handle_initialize(plugin_manager manager, plugin p, loader_impl impl, const loader_path name, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);

		if (iface != NULL)
		{
			loader_path path;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_handle_name(manager, name, path) > 1 && loader_impl_get_handle(impl, path) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Initialize handle failed, handle with name %s already loaded", path);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, NULL, path, LOADER_PATH_SIZE);

			if (handle_impl != NULL)
			{
				handle_impl->populated = 1;

				if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
				{
					if (loader_impl_handle_register(manager, impl, path, handle_impl, handle_ptr) == 0)
					{
						vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

						return 0;
					}

					set_remove(impl->handle_impl_path_map, handle_impl->path);
				}

				{
					size_t iterator;

					for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
					{
						loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

						loader_impl_destroy_handle(iterator_handle_impl);
					}

					vector_pop_back(impl->handle_impl_init_order);
				}

				log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", path);

				loader_impl_destroy_handle(handle_impl);
			}
		}
	}

	return 1;
}